

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

bool __thiscall
source::judge_file(source *this,Request *request,Response *response,CharContent *file_path)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  source *this_00;
  bool bVar4;
  stat file_stat;
  char etag_buf [200];
  CharContent local_228;
  CharContent local_200 [3];
  stat local_188 [2];
  
  pcVar3 = CharContent::c_str(file_path);
  iVar2 = stat(pcVar3,local_188);
  if ((iVar2 < 0) || ((local_188[0].st_mode & 0xf000) != 0x4000)) {
    bVar4 = false;
  }
  else {
    local_228._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    local_228.npos = 0xffffffffffffffff;
    uVar1 = (request->uri).m_length;
    pcVar3 = (char *)operator_new__(uVar1);
    local_228.size = (request->uri).size;
    local_228.m = pcVar3;
    local_228.m_length = uVar1;
    memset(pcVar3,0,uVar1);
    memmove(pcVar3,(request->uri).m,uVar1);
    local_200[0]._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    local_200[0].npos = 0xffffffffffffffff;
    uVar1 = file_path->m_length;
    this_00 = (source *)operator_new__(uVar1);
    local_200[0].size = file_path->size;
    local_200[0].m = (char *)this_00;
    local_200[0].m_length = uVar1;
    memset(this_00,0,uVar1);
    memmove(this_00,file_path->m,uVar1);
    document_iter(this_00,&local_228,response,local_200);
    local_200[0]._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if ((source *)local_200[0].m != (source *)0x0) {
      operator_delete__(local_200[0].m);
    }
    local_228._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    bVar4 = true;
    if (local_228.m != (char *)0x0) {
      operator_delete__(local_228.m);
    }
  }
  return bVar4;
}

Assistant:

bool source::judge_file(Request request,Response *response,CharContent file_path){
	struct stat file_stat;
	if(stat(file_path.c_str(),&file_stat)<0)
		return false;
	if(S_ISDIR(file_stat.st_mode)){
		return this->document_iter(request.uri,response,file_path);
	}
	else if(S_ISREG(file_stat.st_mode)){
		char etag_buf[200]={'\0'};
		snprintf(etag_buf,sizeof(etag_buf),"%lx-%lx",file_stat.st_size,file_stat.st_mtim.tv_sec);
		response->headers["ETag"]=CharContent(etag_buf);
		response->Entity=CharContent(file_stat.st_size);
		return this->file_iter(response,file_path);
	}
	return false;
}